

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O0

void ggml_vec_dot_f32(int n,float *s,size_t bs,float *x,size_t bx,float *y,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  long in_RCX;
  long lVar17;
  long lVar18;
  long lVar19;
  float *in_RSI;
  uint in_EDI;
  long in_R9;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int offset;
  int j;
  int i;
  __m512 ay [4];
  __m512 ax [4];
  __m512 sum [4];
  int np;
  float sumf;
  uint local_6dc;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  int local_6c8;
  int local_6c4;
  undefined8 local_6c0 [32];
  undefined8 local_5c0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  uint local_3b8;
  float local_3b4;
  long local_3b0;
  long local_3a0;
  float *local_390;
  uint local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  local_3b4 = 0.0;
  local_3b8 = in_EDI & 0xffffffc0;
  auVar21 = ZEXT1664((undefined1  [16])0x0);
  local_400 = vmovdqa64_avx512f(auVar21);
  local_440 = vmovdqa64_avx512f(auVar21);
  local_480 = vmovdqa64_avx512f(auVar21);
  vmovdqa64_avx512f(auVar21);
  local_380 = 0;
  uStack_378 = 0;
  uStack_370 = 0;
  uStack_368 = 0;
  uStack_360 = 0;
  uStack_358 = 0;
  uStack_350 = 0;
  uStack_348 = 0;
  local_4c0 = ZEXT1664(ZEXT816(0));
  local_3b0 = in_R9;
  local_3a0 = in_RCX;
  local_390 = in_RSI;
  local_384 = in_EDI;
  for (local_6c4 = 0; local_6c4 < (int)local_3b8; local_6c4 = local_6c4 + 0x40) {
    for (local_6c8 = 0; local_6c8 < 4; local_6c8 = local_6c8 + 1) {
      local_308 = (undefined8 *)(local_3a0 + (long)local_6c4 * 4 + (long)(local_6c8 << 4) * 4);
      uVar2 = local_308[1];
      uVar3 = local_308[2];
      uVar4 = local_308[3];
      uVar5 = local_308[4];
      uVar6 = local_308[5];
      uVar7 = local_308[6];
      uVar8 = local_308[7];
      lVar17 = (long)local_6c8;
      local_5c0[lVar17 * 8] = *local_308;
      local_5c0[lVar17 * 8 + 1] = uVar2;
      local_5c0[lVar17 * 8 + 2] = uVar3;
      local_5c0[lVar17 * 8 + 3] = uVar4;
      local_5c0[lVar17 * 8 + 4] = uVar5;
      local_5c0[lVar17 * 8 + 5] = uVar6;
      local_5c0[lVar17 * 8 + 6] = uVar7;
      local_5c0[lVar17 * 8 + 7] = uVar8;
      local_310 = (undefined8 *)(local_3b0 + (long)local_6c4 * 4 + (long)(local_6c8 << 4) * 4);
      uVar2 = local_310[1];
      uVar3 = local_310[2];
      uVar4 = local_310[3];
      uVar5 = local_310[4];
      uVar6 = local_310[5];
      uVar7 = local_310[6];
      uVar8 = local_310[7];
      lVar17 = (long)local_6c8;
      local_6c0[lVar17 * 8] = *local_310;
      local_6c0[lVar17 * 8 + 1] = uVar2;
      local_6c0[lVar17 * 8 + 2] = uVar3;
      local_6c0[lVar17 * 8 + 3] = uVar4;
      local_6c0[lVar17 * 8 + 4] = uVar5;
      local_6c0[lVar17 * 8 + 5] = uVar6;
      local_6c0[lVar17 * 8 + 6] = uVar7;
      local_6c0[lVar17 * 8 + 7] = uVar8;
      lVar17 = (long)local_6c8;
      lVar18 = (long)local_6c8;
      lVar19 = (long)local_6c8 * 0x40;
      local_280 = local_5c0[lVar17 * 8];
      uStack_278 = local_5c0[lVar17 * 8 + 1];
      uStack_270 = local_5c0[lVar17 * 8 + 2];
      uStack_268 = local_5c0[lVar17 * 8 + 3];
      uStack_260 = local_5c0[lVar17 * 8 + 4];
      uStack_258 = local_5c0[lVar17 * 8 + 5];
      uStack_250 = local_5c0[lVar17 * 8 + 6];
      uStack_248 = local_5c0[lVar17 * 8 + 7];
      local_2c0 = local_6c0[lVar18 * 8];
      uStack_2b8 = local_6c0[lVar18 * 8 + 1];
      uStack_2b0 = local_6c0[lVar18 * 8 + 2];
      uStack_2a8 = local_6c0[lVar18 * 8 + 3];
      uStack_2a0 = local_6c0[lVar18 * 8 + 4];
      uStack_298 = local_6c0[lVar18 * 8 + 5];
      uStack_290 = local_6c0[lVar18 * 8 + 6];
      uStack_288 = local_6c0[lVar18 * 8 + 7];
      local_300 = *(undefined8 *)(local_4c0 + lVar19);
      uStack_2f8 = *(undefined8 *)(local_4c0 + lVar19 + 8);
      uStack_2f0 = *(undefined8 *)(local_4c0 + lVar19 + 0x10);
      uStack_2e8 = *(undefined8 *)(local_4c0 + lVar19 + 0x18);
      uStack_2e0 = *(undefined8 *)(local_4c0 + lVar19 + 0x20);
      uStack_2d8 = *(undefined8 *)(local_480 + lVar19 + -0x18);
      uStack_2d0 = *(undefined8 *)(local_480 + lVar19 + -0x10);
      uStack_2c8 = *(undefined8 *)(local_480 + lVar19 + -8);
      auVar10._8_8_ = local_5c0[lVar17 * 8 + 1];
      auVar10._0_8_ = local_5c0[lVar17 * 8];
      auVar10._16_8_ = local_5c0[lVar17 * 8 + 2];
      auVar10._24_8_ = local_5c0[lVar17 * 8 + 3];
      auVar10._32_8_ = local_5c0[lVar17 * 8 + 4];
      auVar10._40_8_ = local_5c0[lVar17 * 8 + 5];
      auVar10._48_8_ = local_5c0[lVar17 * 8 + 6];
      auVar10._56_8_ = local_5c0[lVar17 * 8 + 7];
      auVar9._8_8_ = local_6c0[lVar18 * 8 + 1];
      auVar9._0_8_ = local_6c0[lVar18 * 8];
      auVar9._16_8_ = local_6c0[lVar18 * 8 + 2];
      auVar9._24_8_ = local_6c0[lVar18 * 8 + 3];
      auVar9._32_8_ = local_6c0[lVar18 * 8 + 4];
      auVar9._40_8_ = local_6c0[lVar18 * 8 + 5];
      auVar9._48_8_ = local_6c0[lVar18 * 8 + 6];
      auVar9._56_8_ = local_6c0[lVar18 * 8 + 7];
      auVar21._8_8_ = *(undefined8 *)(local_4c0 + lVar19 + 8);
      auVar21._0_8_ = *(undefined8 *)(local_4c0 + lVar19);
      auVar21._16_8_ = *(undefined8 *)(local_4c0 + lVar19 + 0x10);
      auVar21._24_8_ = *(undefined8 *)(local_4c0 + lVar19 + 0x18);
      auVar21._32_8_ = *(undefined8 *)(local_4c0 + lVar19 + 0x20);
      auVar21._40_8_ = *(undefined8 *)(local_480 + lVar19 + -0x18);
      auVar21._48_8_ = *(undefined8 *)(local_480 + lVar19 + -0x10);
      auVar21._56_8_ = *(undefined8 *)(local_480 + lVar19 + -8);
      auVar21 = vfmadd213ps_avx512f(auVar9,auVar10,auVar21);
      *(undefined1 (*) [64])(local_4c0 + (long)local_6c8 * 0x40) = auVar21;
    }
  }
  for (local_6d0 = 0; local_6d0 < 2; local_6d0 = local_6d0 + 1) {
    lVar17 = (long)local_6d0 * 0x40;
    lVar18 = (long)(local_6d0 + 2) * 0x40;
    local_100 = *(undefined8 *)(local_4c0 + lVar17);
    uStack_f8 = *(undefined8 *)(local_4c0 + lVar17 + 8);
    uStack_f0 = *(undefined8 *)(local_4c0 + lVar17 + 0x10);
    uStack_e8 = *(undefined8 *)(local_4c0 + lVar17 + 0x18);
    uStack_e0 = *(undefined8 *)(local_4c0 + lVar17 + 0x20);
    uStack_d8 = *(undefined8 *)(local_480 + lVar17 + -0x18);
    uStack_d0 = *(undefined8 *)(local_480 + lVar17 + -0x10);
    uStack_c8 = *(undefined8 *)(local_480 + lVar17 + -8);
    local_140 = *(undefined8 *)(local_4c0 + lVar18);
    uStack_138 = *(undefined8 *)(local_4c0 + lVar18 + 8);
    uStack_130 = *(undefined8 *)(local_4c0 + lVar18 + 0x10);
    uStack_128 = *(undefined8 *)(local_4c0 + lVar18 + 0x18);
    uStack_120 = *(undefined8 *)(local_4c0 + lVar18 + 0x20);
    uStack_118 = *(undefined8 *)(local_480 + lVar18 + -0x18);
    uStack_110 = *(undefined8 *)(local_480 + lVar18 + -0x10);
    uStack_108 = *(undefined8 *)(local_480 + lVar18 + -8);
    auVar16._8_8_ = *(undefined8 *)(local_4c0 + lVar17 + 8);
    auVar16._0_8_ = *(undefined8 *)(local_4c0 + lVar17);
    auVar16._16_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x10);
    auVar16._24_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x18);
    auVar16._32_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x20);
    auVar16._40_8_ = *(undefined8 *)(local_480 + lVar17 + -0x18);
    auVar16._48_8_ = *(undefined8 *)(local_480 + lVar17 + -0x10);
    auVar16._56_8_ = *(undefined8 *)(local_480 + lVar17 + -8);
    auVar15._8_8_ = *(undefined8 *)(local_4c0 + lVar18 + 8);
    auVar15._0_8_ = *(undefined8 *)(local_4c0 + lVar18);
    auVar15._16_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x10);
    auVar15._24_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x18);
    auVar15._32_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x20);
    auVar15._40_8_ = *(undefined8 *)(local_480 + lVar18 + -0x18);
    auVar15._48_8_ = *(undefined8 *)(local_480 + lVar18 + -0x10);
    auVar15._56_8_ = *(undefined8 *)(local_480 + lVar18 + -8);
    auVar21 = vaddps_avx512f(auVar16,auVar15);
    *(undefined1 (*) [64])(local_4c0 + (long)local_6d0 * 0x40) = auVar21;
  }
  for (local_6d4 = 0; local_6d4 < 1; local_6d4 = local_6d4 + 1) {
    lVar17 = (long)local_6d4 * 0x40;
    lVar18 = (long)(local_6d4 + 1) * 0x40;
    local_180 = *(undefined8 *)(local_4c0 + lVar17);
    uStack_178 = *(undefined8 *)(local_4c0 + lVar17 + 8);
    uStack_170 = *(undefined8 *)(local_4c0 + lVar17 + 0x10);
    uStack_168 = *(undefined8 *)(local_4c0 + lVar17 + 0x18);
    uStack_160 = *(undefined8 *)(local_4c0 + lVar17 + 0x20);
    uStack_158 = *(undefined8 *)(local_480 + lVar17 + -0x18);
    uStack_150 = *(undefined8 *)(local_480 + lVar17 + -0x10);
    uStack_148 = *(undefined8 *)(local_480 + lVar17 + -8);
    local_1c0 = *(undefined8 *)(local_4c0 + lVar18);
    uStack_1b8 = *(undefined8 *)(local_4c0 + lVar18 + 8);
    uStack_1b0 = *(undefined8 *)(local_4c0 + lVar18 + 0x10);
    uStack_1a8 = *(undefined8 *)(local_4c0 + lVar18 + 0x18);
    uStack_1a0 = *(undefined8 *)(local_4c0 + lVar18 + 0x20);
    uStack_198 = *(undefined8 *)(local_480 + lVar18 + -0x18);
    uStack_190 = *(undefined8 *)(local_480 + lVar18 + -0x10);
    uStack_188 = *(undefined8 *)(local_480 + lVar18 + -8);
    auVar14._8_8_ = *(undefined8 *)(local_4c0 + lVar17 + 8);
    auVar14._0_8_ = *(undefined8 *)(local_4c0 + lVar17);
    auVar14._16_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x10);
    auVar14._24_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x18);
    auVar14._32_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x20);
    auVar14._40_8_ = *(undefined8 *)(local_480 + lVar17 + -0x18);
    auVar14._48_8_ = *(undefined8 *)(local_480 + lVar17 + -0x10);
    auVar14._56_8_ = *(undefined8 *)(local_480 + lVar17 + -8);
    auVar13._8_8_ = *(undefined8 *)(local_4c0 + lVar18 + 8);
    auVar13._0_8_ = *(undefined8 *)(local_4c0 + lVar18);
    auVar13._16_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x10);
    auVar13._24_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x18);
    auVar13._32_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x20);
    auVar13._40_8_ = *(undefined8 *)(local_480 + lVar18 + -0x18);
    auVar13._48_8_ = *(undefined8 *)(local_480 + lVar18 + -0x10);
    auVar13._56_8_ = *(undefined8 *)(local_480 + lVar18 + -8);
    auVar21 = vaddps_avx512f(auVar14,auVar13);
    *(undefined1 (*) [64])(local_4c0 + (long)local_6d4 * 0x40) = auVar21;
  }
  for (local_6d8 = 0; local_6d8 < 0; local_6d8 = local_6d8 + 1) {
    lVar17 = (long)local_6d8 * 0x40;
    lVar18 = (long)local_6d8 * 0x40;
    local_200 = *(undefined8 *)(local_4c0 + lVar17);
    uStack_1f8 = *(undefined8 *)(local_4c0 + lVar17 + 8);
    uStack_1f0 = *(undefined8 *)(local_4c0 + lVar17 + 0x10);
    uStack_1e8 = *(undefined8 *)(local_4c0 + lVar17 + 0x18);
    uStack_1e0 = *(undefined8 *)(local_4c0 + lVar17 + 0x20);
    uStack_1d8 = *(undefined8 *)(local_480 + lVar17 + -0x18);
    uStack_1d0 = *(undefined8 *)(local_480 + lVar17 + -0x10);
    uStack_1c8 = *(undefined8 *)(local_480 + lVar17 + -8);
    local_240 = *(undefined8 *)(local_4c0 + lVar18);
    uStack_238 = *(undefined8 *)(local_4c0 + lVar18 + 8);
    uStack_230 = *(undefined8 *)(local_4c0 + lVar18 + 0x10);
    uStack_228 = *(undefined8 *)(local_4c0 + lVar18 + 0x18);
    uStack_220 = *(undefined8 *)(local_4c0 + lVar18 + 0x20);
    uStack_218 = *(undefined8 *)(local_480 + lVar18 + -0x18);
    uStack_210 = *(undefined8 *)(local_480 + lVar18 + -0x10);
    uStack_208 = *(undefined8 *)(local_480 + lVar18 + -8);
    auVar12._8_8_ = *(undefined8 *)(local_4c0 + lVar17 + 8);
    auVar12._0_8_ = *(undefined8 *)(local_4c0 + lVar17);
    auVar12._16_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x10);
    auVar12._24_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x18);
    auVar12._32_8_ = *(undefined8 *)(local_4c0 + lVar17 + 0x20);
    auVar12._40_8_ = *(undefined8 *)(local_480 + lVar17 + -0x18);
    auVar12._48_8_ = *(undefined8 *)(local_480 + lVar17 + -0x10);
    auVar12._56_8_ = *(undefined8 *)(local_480 + lVar17 + -8);
    auVar11._8_8_ = *(undefined8 *)(local_4c0 + lVar18 + 8);
    auVar11._0_8_ = *(undefined8 *)(local_4c0 + lVar18);
    auVar11._16_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x10);
    auVar11._24_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x18);
    auVar11._32_8_ = *(undefined8 *)(local_4c0 + lVar18 + 0x20);
    auVar11._40_8_ = *(undefined8 *)(local_480 + lVar18 + -0x18);
    auVar11._48_8_ = *(undefined8 *)(local_480 + lVar18 + -0x10);
    auVar11._56_8_ = *(undefined8 *)(local_480 + lVar18 + -8);
    auVar21 = vaddps_avx512f(auVar12,auVar11);
    *(undefined1 (*) [64])(local_4c0 + (long)local_6d8 * 0x40) = auVar21;
  }
  auVar21 = vaddps_avx512f(local_4c0,ZEXT3264(local_4c0._32_32_));
  auVar20._0_4_ = auVar21._0_4_ + auVar21._16_4_;
  auVar20._4_4_ = auVar21._4_4_ + auVar21._20_4_;
  auVar20._8_4_ = auVar21._8_4_ + auVar21._24_4_;
  auVar20._12_4_ = auVar21._12_4_ + auVar21._28_4_;
  auVar1 = vpermilpd_avx(auVar20,1);
  auVar22._0_4_ = auVar20._0_4_ + auVar1._0_4_;
  auVar22._4_4_ = auVar20._4_4_ + auVar1._4_4_;
  auVar22._8_4_ = auVar20._8_4_ + auVar1._8_4_;
  auVar22._12_4_ = auVar20._12_4_ + auVar1._12_4_;
  auVar1 = vmovshdup_avx(auVar22);
  local_3b4 = auVar22._0_4_ + auVar1._0_4_ + -0.0;
  for (local_6dc = local_3b8; (int)local_6dc < (int)local_384; local_6dc = local_6dc + 1) {
    auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_3b0 + (long)(int)local_6dc * 4)),
                             ZEXT416(*(uint *)(local_3a0 + (long)(int)local_6dc * 4)),
                             ZEXT416((uint)local_3b4));
    local_3b4 = auVar1._0_4_;
  }
  *local_390 = local_3b4;
  return;
}

Assistant:

void ggml_vec_dot_f32(int n, float * GGML_RESTRICT s, size_t bs, const float * GGML_RESTRICT x, size_t bx, const float * GGML_RESTRICT y, size_t by, int nrc) {
   assert(nrc == 1);
   GGML_UNUSED(nrc);
   GGML_UNUSED(bx);
   GGML_UNUSED(by);
   GGML_UNUSED(bs);

#if defined(GGML_SIMD)
    float sumf = 0.0f;
    const int np = (n & ~(GGML_F32_STEP - 1));

    GGML_F32_VEC sum[GGML_F32_ARR] = { GGML_F32_VEC_ZERO };

    GGML_F32_VEC ax[GGML_F32_ARR];
    GGML_F32_VEC ay[GGML_F32_ARR];

    for (int i = 0; i < np; i += GGML_F32_STEP) {
        for (int j = 0; j < GGML_F32_ARR; j++) {
            ax[j] = GGML_F32_VEC_LOAD(x + i + j*GGML_F32_EPR);
            ay[j] = GGML_F32_VEC_LOAD(y + i + j*GGML_F32_EPR);

            sum[j] = GGML_F32_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F32_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += x[i]*y[i];
    }
#else
    // scalar
    ggml_float sumf = 0.0;
    for (int i = 0; i < n; ++i) {
        sumf += (ggml_float)(x[i]*y[i]);
    }
#endif

    *s = sumf;
}